

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FragmentOutExecutor::bindAttributes
          (FragmentOutExecutor *this,int numValues,void **inputs)

{
  void *dataPtr;
  bool bVar1;
  DataType dataType;
  int iVar2;
  VkFormat format_00;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  int local_58;
  int attrNdx;
  int numCols;
  int numRows;
  int numAttrsToAdd;
  int elementSize;
  VkFormat format;
  int vecSize;
  DataType basicType;
  void *ptr;
  Symbol *symbol;
  int inputNdx;
  void **inputs_local;
  int numValues_local;
  FragmentOutExecutor *this_local;
  
  for (symbol._4_4_ = 0;
      sVar4 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ::size(&(this->super_ShaderExecutor).m_shaderSpec.inputs), symbol._4_4_ < (int)sVar4;
      symbol._4_4_ = symbol._4_4_ + 1) {
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->super_ShaderExecutor).m_shaderSpec.inputs,(long)symbol._4_4_);
    dataPtr = inputs[symbol._4_4_];
    dataType = glu::VarType::getBasicType(&pvVar5->varType);
    iVar2 = glu::getDataTypeScalarSize(dataType);
    format_00 = getAttributeFormat(dataType);
    numRows = 0;
    numCols = 1;
    bVar1 = glu::isDataTypeFloatOrVec(dataType);
    if (bVar1) {
      numRows = 4;
    }
    else {
      bVar1 = glu::isDataTypeIntOrIVec(dataType);
      if (bVar1) {
        numRows = 4;
      }
      else {
        bVar1 = glu::isDataTypeUintOrUVec(dataType);
        if (bVar1) {
          numRows = 4;
        }
        else {
          bVar1 = glu::isDataTypeMatrix(dataType);
          if (bVar1) {
            iVar3 = glu::getDataTypeMatrixNumRows(dataType);
            numCols = glu::getDataTypeMatrixNumColumns(dataType);
            numRows = iVar3 * numCols * 4;
          }
        }
      }
    }
    for (local_58 = 0; local_58 < numCols; local_58 = local_58 + 1) {
      sVar4 = std::
              vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              ::size(&this->m_vertexBindingDescriptions);
      addAttribute(this,(deUint32)sVar4,format_00,numRows * iVar2,numValues,dataPtr);
    }
  }
  return;
}

Assistant:

void FragmentOutExecutor::bindAttributes (int numValues, const void* const* inputs)
{
	// Input attributes
	for (int inputNdx = 0; inputNdx < (int)m_shaderSpec.inputs.size(); inputNdx++)
	{
		const Symbol&		symbol			= m_shaderSpec.inputs[inputNdx];
		const void*			ptr				= inputs[inputNdx];
		const glu::DataType	basicType		= symbol.varType.getBasicType();
		const int			vecSize			= glu::getDataTypeScalarSize(basicType);
		const VkFormat		format			= getAttributeFormat(basicType);
		int					elementSize		= 0;
		int					numAttrsToAdd	= 1;

		if (glu::isDataTypeFloatOrVec(basicType))
			elementSize = sizeof(float);
		else if (glu::isDataTypeIntOrIVec(basicType))
			elementSize = sizeof(int);
		else if (glu::isDataTypeUintOrUVec(basicType))
			elementSize = sizeof(deUint32);
		else if (glu::isDataTypeMatrix(basicType))
		{
			int		numRows	= glu::getDataTypeMatrixNumRows(basicType);
			int		numCols	= glu::getDataTypeMatrixNumColumns(basicType);

			elementSize = numRows * numCols * (int)sizeof(float);
			numAttrsToAdd = numCols;
		}
		else
			DE_ASSERT(false);

		// add attributes, in case of matrix every column is binded as an attribute
		for (int attrNdx = 0; attrNdx < numAttrsToAdd; attrNdx++)
		{
			addAttribute((deUint32)m_vertexBindingDescriptions.size(), format, elementSize * vecSize, numValues, ptr);
		}
	}
}